

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeModuleDynamicLink
          (uint32_t numModules,ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLinkLog
          )

{
  code *pcVar1;
  ulong uVar2;
  void *pvVar3;
  object_t<_ze_module_build_log_handle_t_*> *poVar4;
  bad_alloc *anon_var_0;
  ulong local_48;
  size_t i;
  ze_module_handle_t *phModulesLocal;
  ze_pfnModuleDynamicLink_t pfnDynamicLink;
  dditable_t *dditable;
  ze_module_build_log_handle_t *pp_Stack_20;
  ze_result_t result;
  ze_module_build_log_handle_t *phLinkLog_local;
  ze_module_handle_t *phModules_local;
  uint32_t numModules_local;
  
  dditable._4_4_ = 0;
  pfnDynamicLink = *(ze_pfnModuleDynamicLink_t *)(*phModules + 8);
  pcVar1 = *(code **)(pfnDynamicLink + 0x508);
  if (pcVar1 == (code *)0x0) {
    phModules_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = SUB168(ZEXT416(numModules) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numModules) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pp_Stack_20 = phLinkLog;
    phLinkLog_local = (ze_module_build_log_handle_t *)phModules;
    phModules_local._0_4_ = numModules;
    pvVar3 = operator_new__(uVar2);
    for (local_48 = 0;
        phLinkLog_local != (ze_module_build_log_handle_t *)0x0 &&
        local_48 < (uint32_t)phModules_local; local_48 = local_48 + 1) {
      *(undefined8 *)((long)pvVar3 + local_48 * 8) = *(undefined8 *)phLinkLog_local[local_48];
    }
    dditable._4_4_ = (*pcVar1)((uint32_t)phModules_local,pvVar3,pp_Stack_20);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    if (pp_Stack_20 != (_ze_module_build_log_handle_t **)0x0) {
      poVar4 = singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
               ::getInstance<_ze_module_build_log_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
                           *)(context + 0x4e0),pp_Stack_20,(dditable_t **)&pfnDynamicLink);
      *pp_Stack_20 = (ze_module_build_log_handle_t)poVar4;
    }
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      phModules_local._4_4_ = dditable._4_4_;
    }
    else {
      phModules_local._4_4_ = dditable._4_4_;
    }
  }
  return phModules_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleDynamicLink(
        uint32_t numModules,                            ///< [in] number of modules to be linked pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to
                                                        ///< dynamically link together.
        ze_module_build_log_handle_t* phLinkLog         ///< [out][optional] pointer to handle of dynamic link log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( phModules[ 0 ] )->dditable;
        auto pfnDynamicLink = dditable->ze.Module.pfnDynamicLink;
        if( nullptr == pfnDynamicLink )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handles to driver handles
        auto phModulesLocal = new ze_module_handle_t [numModules];
        for( size_t i = 0; ( nullptr != phModules ) && ( i < numModules ); ++i )
            phModulesLocal[ i ] = reinterpret_cast<ze_module_object_t*>( phModules[ i ] )->handle;

        // forward to device-driver
        result = pfnDynamicLink( numModules, phModulesLocal, phLinkLog );
        delete []phModulesLocal;

        try
        {
            // convert driver handle to loader handle
            if( nullptr != phLinkLog )
                *phLinkLog = reinterpret_cast<ze_module_build_log_handle_t>(
                    context->ze_module_build_log_factory.getInstance( *phLinkLog, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        if( ZE_RESULT_SUCCESS != result )
            return result;

        return result;
    }